

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mc64ad.c
# Opt level: O0

int_t mc64rd_(int_t *n,int_t *ne,int_t *ip,int_t *irn,double *a)

{
  double dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int_t iVar5;
  int iVar6;
  int local_148;
  int_t first;
  int_t todo [50];
  double dStack_78;
  int_t last;
  double key;
  int_t ipj;
  int_t len;
  int_t mid;
  int_t td;
  int_t hi;
  double ha;
  int local_48;
  int_t s;
  int_t r__;
  int_t k;
  int_t j;
  int_t i__3;
  int_t i__2;
  int_t i__1;
  double *a_local;
  int_t *irn_local;
  int_t *ip_local;
  int_t *ne_local;
  int_t *n_local;
  
  iVar2 = *n;
  r__ = 1;
  while( true ) {
    if (iVar2 < r__) {
      return 0;
    }
    iVar6 = ip[(long)(r__ + 1) + -1] - ip[(long)r__ + -1];
    if (1 < iVar6) break;
LAB_0011c867:
    r__ = r__ + 1;
  }
  iVar3 = ip[(long)r__ + -1];
  if (0xe < iVar6) {
    local_148 = iVar3;
    first = iVar3 + iVar6;
    len = 2;
LAB_0011c47d:
    iVar4 = (&local_148)[len + -2];
    todo[0x31] = (&local_148)[len + -1];
    dVar1 = a[(long)((iVar4 + todo[0x31]) / 2) + -1];
    s = iVar4;
LAB_0011c4e8:
    if (todo[0x31] + -1 < s) {
      len = len + -2;
    }
    else {
      dStack_78 = a[(long)s + -1];
      if ((dStack_78 == dVar1) && (!NAN(dStack_78) && !NAN(dVar1))) goto LAB_0011c52e;
      if (dVar1 < dStack_78) {
        dStack_78 = dVar1;
      }
      ipj = iVar4;
      for (s = iVar4; s <= todo[0x31] + -1; s = s + 1) {
        if (dStack_78 < a[(long)s + -1]) {
          dVar1 = a[(long)ipj + -1];
          a[(long)ipj + -1] = a[(long)s + -1];
          a[(long)s + -1] = dVar1;
          iVar5 = irn[(long)ipj + -1];
          irn[(long)ipj + -1] = irn[(long)s + -1];
          irn[(long)s + -1] = iVar5;
          ipj = ipj + 1;
        }
      }
      if (ipj - iVar4 < todo[0x31] - ipj) {
        (&local_148)[len + 1] = ipj;
        (&local_148)[len] = iVar4;
        (&local_148)[len + -1] = todo[0x31];
        (&local_148)[len + -2] = ipj;
      }
      else {
        (&local_148)[len + 1] = todo[0x31];
        (&local_148)[len] = ipj;
        (&local_148)[len + -1] = ipj;
      }
      len = len + 2;
    }
    goto LAB_0011c6a8;
  }
LAB_0011c6e4:
  iVar4 = iVar3;
LAB_0011c6f9:
  do {
    ha._4_4_ = iVar4;
    local_48 = ha._4_4_ + 1;
    if (iVar3 + iVar6 + -1 < local_48) goto LAB_0011c867;
    iVar4 = local_48;
    if (a[(long)ha._4_4_ + -1] < a[(long)local_48 + -1]) {
      dVar1 = a[(long)local_48 + -1];
      iVar5 = irn[(long)local_48 + -1];
      a[(long)local_48 + -1] = a[(long)ha._4_4_ + -1];
      irn[(long)local_48 + -1] = irn[(long)ha._4_4_ + -1];
      for (; iVar3 + 1 <= ha._4_4_; ha._4_4_ = ha._4_4_ + -1) {
        if (dVar1 <= a[(long)(ha._4_4_ + -1) + -1]) {
          a[(long)ha._4_4_ + -1] = dVar1;
          irn[(long)ha._4_4_ + -1] = iVar5;
          iVar4 = local_48;
          goto LAB_0011c6f9;
        }
        a[(long)ha._4_4_ + -1] = a[(long)(ha._4_4_ + -1) + -1];
        irn[(long)ha._4_4_ + -1] = irn[(long)(ha._4_4_ + -1) + -1];
      }
      a[(long)iVar3 + -1] = dVar1;
      irn[(long)iVar3 + -1] = iVar5;
      iVar4 = local_48;
    }
  } while( true );
LAB_0011c52e:
  s = s + 1;
  goto LAB_0011c4e8;
LAB_0011c6a8:
  if (len == 0) goto LAB_0011c6e4;
  if (0xe < (&local_148)[len + -1] - (&local_148)[len + -2]) goto LAB_0011c47d;
  len = len + -2;
  goto LAB_0011c6a8;
}

Assistant:

int_t mc64rd_(int_t *n, int_t *ne, int_t *ip, int_t *
	irn, double *a)
{
    /* System generated locals */
    int_t i__1, i__2, i__3;

    /* Local variables */
    int_t j, k, r__, s;
    double ha;
    int_t hi, td, mid, len, ipj;
    double key;
    int_t last, todo[50], first;


/* *** Copyright (c) 1999  Council for the Central Laboratory of the */
/*     Research Councils                                             *** */
/* *** Although every effort has been made to ensure robustness and  *** */
/* *** reliability of the subroutines in this MC64 suite, we         *** */
/* *** disclaim any liability arising through the use or misuse of   *** */
/* *** any of the subroutines.                                       *** */
/* *** Any problems?   Contact ... */
/*     Iain Duff (I.Duff@rl.ac.uk) or Jacko Koster (jak@ii.uib.no)   *** */

/* This subroutine sorts the entries in each column of the */
/* sparse matrix (defined by N,NE,IP,IRN,A) by decreasing */
/* numerical value. */
/* Local constants */
/* Local variables */
/* Local arrays */
    /* Parameter adjustments */
    --ip;
    --a;
    --irn;

    /* Function Body */
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	len = ip[j + 1] - ip[j];
	if (len <= 1) {
	    goto L100;
	}
	ipj = ip[j];
/* Sort array roughly with partial quicksort */
	if (len < 15) {
	    goto L400;
	}
	todo[0] = ipj;
	todo[1] = ipj + len;
	td = 2;
L500:
	first = todo[td - 2];
	last = todo[td - 1];
/* KEY is the smallest of two values present in interval [FIRST,LAST) */
	key = a[(first + last) / 2];
	i__2 = last - 1;
	for (k = first; k <= i__2; ++k) {
	    ha = a[k];
	    if (ha == key) {
		goto L475;
	    }
	    if (ha > key) {
		goto L470;
	    }
	    key = ha;
	    goto L470;
L475:
	    ;
	}
/* Only one value found in interval, so it is already sorted */
	td += -2;
	goto L425;
/* Reorder interval [FIRST,LAST) such that entries before MID are gt KEY */
L470:
	mid = first;
	i__2 = last - 1;
	for (k = first; k <= i__2; ++k) {
	    if (a[k] <= key) {
		goto L450;
	    }
	    ha = a[mid];
	    a[mid] = a[k];
	    a[k] = ha;
	    hi = irn[mid];
	    irn[mid] = irn[k];
	    irn[k] = hi;
	    ++mid;
L450:
	    ;
	}
/* Both subintervals [FIRST,MID), [MID,LAST) are nonempty */
/* Stack the longest of the two subintervals first */
	if (mid - first >= last - mid) {
	    todo[td + 1] = last;
	    todo[td] = mid;
	    todo[td - 1] = mid;
/*          TODO(TD-1) = FIRST */
	} else {
	    todo[td + 1] = mid;
	    todo[td] = first;
	    todo[td - 1] = last;
	    todo[td - 2] = mid;
	}
	td += 2;
L425:
	if (td == 0) {
	    goto L400;
	}
/* There is still work to be done */
	if (todo[td - 1] - todo[td - 2] >= 15) {
	    goto L500;
	}
/* Next interval is already short enough for straightforward insertion */
	td += -2;
	goto L425;
/* Complete sorting with straightforward insertion */
L400:
	i__2 = ipj + len - 1;
	for (r__ = ipj + 1; r__ <= i__2; ++r__) {
	    if (a[r__ - 1] < a[r__]) {
		ha = a[r__];
		hi = irn[r__];
		a[r__] = a[r__ - 1];
		irn[r__] = irn[r__ - 1];
		i__3 = ipj + 1;
		for (s = r__ - 1; s >= i__3; --s) {
		    if (a[s - 1] < ha) {
			a[s] = a[s - 1];
			irn[s] = irn[s - 1];
		    } else {
			a[s] = ha;
			irn[s] = hi;
			goto L200;
		    }
/* L300: */
		}
		a[ipj] = ha;
		irn[ipj] = hi;
	    }
L200:
	    ;
	}
L100:
	;
    }
    return 0;
}